

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::TestCase::matchesTags(TestCase *this,string *tagPattern)

{
  bool bVar1;
  TagExpressionParser local_78;
  undefined1 local_30 [8];
  TagExpression exp;
  string *tagPattern_local;
  TestCase *this_local;
  
  exp.m_tagSets.super__Vector_base<Catch::TagSet,_std::allocator<Catch::TagSet>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)tagPattern;
  TagExpression::TagExpression((TagExpression *)local_30);
  TagExpressionParser::TagExpressionParser(&local_78,(TagExpression *)local_30);
  TagParser::parse(&local_78.super_TagParser,
                   (string *)
                   exp.m_tagSets.super__Vector_base<Catch::TagSet,_std::allocator<Catch::TagSet>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  TagExpressionParser::~TagExpressionParser(&local_78);
  bVar1 = TagExpression::matches((TagExpression *)local_30,&(this->super_TestCaseInfo).tags);
  TagExpression::~TagExpression((TagExpression *)local_30);
  return bVar1;
}

Assistant:

bool TestCase::matchesTags( std::string const& tagPattern ) const {
        TagExpression exp;
        TagExpressionParser( exp ).parse( tagPattern );
        return exp.matches( tags );
    }